

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

CURLcode req_flush(Curl_easy *data)

{
  bufq *q;
  size_t *psVar1;
  _Bool _Var2;
  CURLcode CVar3;
  CURLcode CVar4;
  uint uVar5;
  ulong hds_len;
  size_t blen;
  uchar *buf;
  ulong local_48;
  uchar *local_40;
  size_t local_38;
  
  CVar3 = CURLE_FAILED_INIT;
  if ((data != (Curl_easy *)0x0) && (data->conn != (connectdata *)0x0)) {
    q = &(data->req).sendbuf;
    _Var2 = Curl_bufq_is_empty(q);
    if (_Var2) {
      _Var2 = Curl_xfer_needs_flush(data);
      if (_Var2) {
        CVar3 = Curl_xfer_flush(data);
        return CVar3;
      }
    }
    else {
      _Var2 = Curl_bufq_peek(q,&local_40,&local_48);
      if (_Var2) {
        do {
          hds_len = (data->req).sendbuf_hds_len;
          if (local_48 <= hds_len) {
            hds_len = local_48;
          }
          CVar3 = xfer_send(data,(char *)CONCAT71(local_40._1_7_,(byte)local_40),local_48,hds_len,
                            &local_38);
          if (CVar3 != CURLE_OK) {
            return CVar3;
          }
          Curl_bufq_skip(q,local_38);
          if (hds_len != 0) {
            if (local_38 <= hds_len) {
              hds_len = local_38;
            }
            psVar1 = &(data->req).sendbuf_hds_len;
            *psVar1 = *psVar1 - hds_len;
          }
        } while ((local_48 <= local_38) && (_Var2 = Curl_bufq_peek(q,&local_40,&local_48), _Var2));
      }
      _Var2 = Curl_bufq_is_empty(q);
      if (!_Var2) {
        return CURLE_AGAIN;
      }
    }
    uVar5 = *(uint *)&(data->req).field_0xd9;
    if ((uVar5 & 0x60) == 0x20) {
      CVar3 = xfer_send(data,(char *)&local_48,0,0,(size_t *)&local_40);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      uVar5 = *(uint *)&(data->req).field_0xd9;
    }
    CVar3 = CURLE_OK;
    if ((uVar5 & 0x160) == 0x60) {
      if ((uVar5 >> 0x14 & 1) != 0) {
        CVar4 = Curl_xfer_send_shutdown(data,(_Bool *)&local_40);
        CVar3 = CURLE_AGAIN;
        if (((byte)local_40 & 1) != 0) {
          CVar3 = CURLE_OK;
        }
        if (CVar4 != CURLE_OK) {
          CVar3 = CVar4;
        }
        if ((CVar4 == CURLE_OK & (byte)local_40) != 1) {
          return CVar3;
        }
      }
      CVar3 = Curl_req_set_upload_done(data);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode req_flush(struct Curl_easy *data)
{
  CURLcode result;

  if(!data || !data->conn)
    return CURLE_FAILED_INIT;

  if(!Curl_bufq_is_empty(&data->req.sendbuf)) {
    result = req_send_buffer_flush(data);
    if(result)
      return result;
    if(!Curl_bufq_is_empty(&data->req.sendbuf)) {
      DEBUGF(infof(data, "Curl_req_flush(len=%zu) -> EAGAIN",
             Curl_bufq_len(&data->req.sendbuf)));
      return CURLE_AGAIN;
    }
  }
  else if(Curl_xfer_needs_flush(data)) {
    DEBUGF(infof(data, "Curl_req_flush(), xfer send_pending"));
    return Curl_xfer_flush(data);
  }

  if(data->req.eos_read && !data->req.eos_sent) {
    char tmp;
    size_t nwritten;
    result = xfer_send(data, &tmp, 0, 0, &nwritten);
    if(result)
      return result;
    DEBUGASSERT(data->req.eos_sent);
  }

  if(!data->req.upload_done && data->req.eos_read && data->req.eos_sent) {
    DEBUGASSERT(Curl_bufq_is_empty(&data->req.sendbuf));
    if(data->req.shutdown) {
      bool done;
      result = Curl_xfer_send_shutdown(data, &done);
      if(result)
        return result;
      if(!done)
        return CURLE_AGAIN;
    }
    return Curl_req_set_upload_done(data);
  }
  return CURLE_OK;
}